

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O0

void __thiscall NPC::Damage(NPC *this,Character *from,int amount,int spell_id)

{
  World *pWVar1;
  Character *pCVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  mapped_type *this_00;
  ENF_Data *pEVar8;
  pointer pNVar9;
  reference this_01;
  list<Character_*,_std::allocator<Character_*>_> *this_02;
  reference ppCVar10;
  PacketFamily family;
  double dVar11;
  Character *character;
  iterator __end2;
  iterator __begin2;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  int local_d0;
  int local_cc;
  undefined1 local_c8 [8];
  PacketBuilder builder;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *checkopp;
  iterator __end1;
  iterator __begin1;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *__range1;
  bool found;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> opponent;
  allocator<char> local_49;
  key_type local_48;
  int local_24;
  int local_20;
  int limitamount;
  int spell_id_local;
  int amount_local;
  Character *from_local;
  NPC *this_local;
  
  local_20 = spell_id;
  limitamount = amount;
  _spell_id_local = from;
  from_local = (Character *)this;
  piVar7 = std::min<int>(&this->hp,&limitamount);
  local_24 = *piVar7;
  pWVar1 = this->map->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"LimitDamage",&local_49);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar1->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_48);
  bVar3 = util::variant::operator_cast_to_bool(this_00);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar3) {
    limitamount = local_24;
  }
  pEVar8 = ENF(this);
  if ((pEVar8->type == Passive) || (pEVar8 = ENF(this), pEVar8->type == Aggressive)) {
    this->hp = this->hp - local_24;
  }
  else {
    this->hp = 0;
    limitamount = 0;
  }
  if (this->totaldamage < this->totaldamage + local_24) {
    this->totaldamage = local_24 + this->totaldamage;
  }
  pNVar9 = (pointer)operator_new(0x18);
  std::unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>>::
  unique_ptr<std::default_delete<NPC_Opponent>,void>
            ((unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>> *)&stack0xffffffffffffff98,
             pNVar9);
  bVar3 = false;
  __end1 = std::__cxx11::
           list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
           ::begin(&this->damagelist);
  checkopp = (unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
             std::__cxx11::
             list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
             ::end(&this->damagelist);
  while (bVar4 = std::operator!=(&__end1,(_Self *)&checkopp), pCVar2 = _spell_id_local, bVar4) {
    this_01 = std::
              _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
              operator*(&__end1);
    pNVar9 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->(this_01);
    if (pNVar9->attacker == _spell_id_local) {
      bVar3 = true;
      pNVar9 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                         (this_01);
      iVar5 = pNVar9->damage + local_24;
      pNVar9 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                         (this_01);
      iVar6 = local_24;
      if (pNVar9->damage < iVar5) {
        pNVar9 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                           (this_01);
        pNVar9->damage = iVar6 + pNVar9->damage;
      }
      dVar11 = Timer::GetTime();
      pNVar9 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                         (this_01);
      pNVar9->last_hit = dVar11;
    }
    std::_List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
    operator++(&__end1);
  }
  if (!bVar3) {
    pNVar9 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                       ((unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
                        &stack0xffffffffffffff98);
    iVar6 = local_24;
    pNVar9->attacker = pCVar2;
    pNVar9 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                       ((unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
                        &stack0xffffffffffffff98);
    pNVar9->damage = iVar6;
    dVar11 = Timer::GetTime();
    pNVar9 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                       ((unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
                        &stack0xffffffffffffff98);
    pNVar9->last_hit = dVar11;
    pNVar9 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                       ((unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
                        &stack0xffffffffffffff98);
    builder.add_size = (size_t)this;
    std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::push_back
              (&pNVar9->attacker->unregister_npc,(value_type *)&builder.add_size);
    std::__cxx11::
    list<std::unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>>,std::allocator<std::unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>>>>
    ::emplace_back<std::unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>>>
              ((list<std::unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>>,std::allocator<std::unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>>>>
                *)&this->damagelist,
               (unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
               &stack0xffffffffffffff98);
  }
  if (this->hp < 1) {
    Killed(this,_spell_id_local,limitamount,local_20);
  }
  else {
    family = PACKET_CAST;
    if (local_20 == -1) {
      family = PACKET_NPC;
    }
    PacketBuilder::PacketBuilder((PacketBuilder *)local_c8,family,PACKET_REPLY,0xe);
    if (local_20 != -1) {
      PacketBuilder::AddShort((PacketBuilder *)local_c8,local_20);
    }
    iVar6 = Character::PlayerID(_spell_id_local);
    PacketBuilder::AddShort((PacketBuilder *)local_c8,iVar6);
    PacketBuilder::AddChar((PacketBuilder *)local_c8,(uint)_spell_id_local->direction);
    PacketBuilder::AddShort((PacketBuilder *)local_c8,(uint)this->index);
    PacketBuilder::AddThree((PacketBuilder *)local_c8,limitamount);
    iVar6 = this->hp;
    pEVar8 = ENF(this);
    local_cc = (int)(((double)iVar6 / (double)pEVar8->hp) * 100.0);
    local_d0 = 0;
    __range2._4_4_ = 100;
    iVar6 = util::clamp<int>(&local_cc,&local_d0,(int *)((long)&__range2 + 4));
    PacketBuilder::AddShort((PacketBuilder *)local_c8,iVar6);
    if (local_20 == -1) {
      PacketBuilder::AddChar((PacketBuilder *)local_c8,1);
    }
    else {
      PacketBuilder::AddShort((PacketBuilder *)local_c8,_spell_id_local->tp);
    }
    this_02 = &this->map->characters;
    __end2 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_02);
    character = (Character *)
                std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_02);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&character), bVar3) {
      ppCVar10 = std::_List_iterator<Character_*>::operator*(&__end2);
      pCVar2 = *ppCVar10;
      bVar3 = Character::InRange(pCVar2,this);
      if (bVar3) {
        Character::Send(pCVar2,(PacketBuilder *)local_c8);
      }
      std::_List_iterator<Character_*>::operator++(&__end2);
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_c8);
  }
  std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::~unique_ptr
            ((unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
             &stack0xffffffffffffff98);
  return;
}

Assistant:

void NPC::Damage(Character *from, int amount, int spell_id)
{
	int limitamount = std::min(this->hp, amount);

	if (this->map->world->config["LimitDamage"])
	{
		amount = limitamount;
	}

	if (this->ENF().type == ENF::Passive || this->ENF().type == ENF::Aggressive)
	{
		this->hp -= limitamount;
	}
	else
	{
		this->hp = 0;
		amount = 0;
	}

	if (this->totaldamage + limitamount > this->totaldamage)
		this->totaldamage += limitamount;

	std::unique_ptr<NPC_Opponent> opponent(new NPC_Opponent);
	bool found = false;

	UTIL_FOREACH_CREF(this->damagelist, checkopp)
	{
		if (checkopp->attacker == from)
		{
			found = true;

			if (checkopp->damage + limitamount > checkopp->damage)
				checkopp->damage += limitamount;

			checkopp->last_hit = Timer::GetTime();
		}
	}

	if (!found)
	{
		opponent->attacker = from;
		opponent->damage = limitamount;
		opponent->last_hit = Timer::GetTime();
		opponent->attacker->unregister_npc.push_back(this);
		this->damagelist.emplace_back(std::move(opponent));
	}

	if (this->hp > 0)
	{
		PacketBuilder builder(spell_id == -1 ? PACKET_NPC : PACKET_CAST, PACKET_REPLY, 14);

		if (spell_id != -1)
			builder.AddShort(spell_id);

		builder.AddShort(from->PlayerID());
		builder.AddChar(from->direction);
		builder.AddShort(this->index);
		builder.AddThree(amount);
		builder.AddShort(util::clamp<int>(double(this->hp) / double(this->ENF().hp) * 100.0, 0, 100));

		if (spell_id != -1)
			builder.AddShort(from->tp);
		else
			builder.AddChar(1); // ?

		UTIL_FOREACH(this->map->characters, character)
		{
			if (character->InRange(this))
			{
				character->Send(builder);
			}
		}
	}
	else
	{
		this->Killed(from, amount, spell_id);
		// *this may not be valid here
		return;
	}
}